

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.h
# Opt level: O0

void * __thiscall
uWS::HttpParser::consumePostPadded
          (HttpParser *this,char *data,int length,void *user,
          unique_function<void_*(void_*,_HttpRequest_*)> *requestHandler,
          unique_function<void_*(void_*,_std::string_view,_bool)> *dataHandler,
          unique_function<void_*(void_*)> *errorHandler)

{
  basic_string_view<char,_std::char_traits<char>_> args_1;
  basic_string_view<char,_std::char_traits<char>_> args_1_00;
  basic_string_view<char,_std::char_traits<char>_> args_1_01;
  basic_string_view<char,_std::char_traits<char>_> args_1_02;
  int iVar1;
  undefined4 uVar2;
  void *pvVar3;
  long lVar4;
  unsigned_long *puVar5;
  void *in_RCX;
  uint in_EDX;
  char *in_RSI;
  char *in_RDI;
  operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_*(void_*)>_>,_void_*(void_*)>
  *in_R9;
  pair<int,_void_*> pVar6;
  pair<int,_void_*> consumed;
  void *returnedUser_3;
  void *returnedUser_2;
  pair<int,_void_*> consumed_1;
  int maxCopyDistance;
  int had;
  void *returnedUser_1;
  void *returnedUser;
  HttpRequest req;
  operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_*(void_*)>_>,_void_*(void_*)>
  *args;
  operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_*(void_*)>_>,_void_*(void_*)>
  *in_stack_fffffffffffff830;
  void *in_stack_fffffffffffff838;
  HttpRequest *in_stack_fffffffffffff840;
  size_t in_stack_fffffffffffff848;
  char *in_stack_fffffffffffff850;
  char *pcVar7;
  basic_string_view<char,_std::char_traits<char>_> local_760;
  void *local_750;
  basic_string_view<char,_std::char_traits<char>_> local_748;
  int local_730;
  void *local_728;
  int local_71c;
  unsigned_long local_718;
  unsigned_long local_710;
  HttpRequest *in_stack_fffffffffffff900;
  char *in_stack_fffffffffffff908;
  undefined8 in_stack_fffffffffffff910;
  int length_00;
  char *in_stack_fffffffffffff918;
  HttpParser *in_stack_fffffffffffff920;
  unique_function<void_*(void_*,_HttpRequest_*)> *in_stack_fffffffffffff928;
  HttpRequest *in_stack_fffffffffffff930;
  void *in_stack_fffffffffffff938;
  undefined4 in_stack_fffffffffffff940;
  int in_stack_fffffffffffff944;
  char *in_stack_fffffffffffff948;
  HttpParser *in_stack_fffffffffffff950;
  unique_function<void_*(void_*,_std::string_view,_bool)> *in_stack_fffffffffffff970;
  uint local_1c;
  char *local_18;
  void *local_8;
  
  length_00 = (int)((ulong)in_stack_fffffffffffff910 >> 0x20);
  HttpRequest::HttpRequest(in_stack_fffffffffffff840);
  if (*(int *)(in_RDI + 0x20) == 0) {
    lVar4 = std::__cxx11::string::length();
    local_1c = in_EDX;
    local_18 = in_RSI;
    if (lVar4 == 0) goto LAB_0023fafd;
    iVar1 = std::__cxx11::string::length();
    pcVar7 = *(char **)(in_RDI + 0x28);
    lVar4 = std::__cxx11::string::length();
    local_710 = (long)pcVar7 - lVar4;
    local_718 = (unsigned_long)(int)in_EDX;
    puVar5 = std::min<unsigned_long>(&local_710,&local_718);
    uVar2 = (undefined4)*puVar5;
    std::__cxx11::string::length();
    local_71c = 0x20;
    std::max<int>(&MINIMUM_HTTP_POST_PADDING,&local_71c);
    std::__cxx11::string::reserve((ulong)in_RDI);
    std::__cxx11::string::append(in_RDI,(ulong)in_RSI);
    std::__cxx11::string::data();
    std::__cxx11::string::length();
    args = in_R9;
    pVar6 = fenceAndConsumePostPadded<1>
                      (in_stack_fffffffffffff920,in_stack_fffffffffffff918,length_00,
                       in_stack_fffffffffffff908,in_stack_fffffffffffff900,
                       (unique_function<void_*(void_*,_HttpRequest_*)> *)CONCAT44(iVar1,uVar2),
                       (unique_function<void_*(void_*,_std::string_view,_bool)> *)
                       CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
    local_728 = pVar6.second;
    local_730 = pVar6.first;
    if (local_728 != in_RCX) {
      return local_728;
    }
    if (local_730 == 0) {
      lVar4 = std::__cxx11::string::length();
      if (lVar4 != *(long *)(in_RDI + 0x28)) {
        return in_RCX;
      }
      pvVar3 = fu2::abi_400::detail::type_erasure::invocation_table::
               operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_*(void_*)>_>,_void_*(void_*)>
               ::operator()(in_stack_fffffffffffff830,args);
      return pvVar3;
    }
    std::__cxx11::string::clear();
    local_18 = in_RSI + (local_730 - iVar1);
    local_1c = in_EDX - (local_730 - iVar1);
    if (*(int *)(in_RDI + 0x20) == 0) goto LAB_0023fafd;
    if (local_1c <= *(uint *)(in_RDI + 0x20)) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_748,local_18,(long)(int)local_1c);
      args_1_01._M_str = pcVar7;
      args_1_01._M_len = (size_t)in_RCX;
      pvVar3 = fu2::abi_400::detail::type_erasure::invocation_table::
               operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_*(void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_>,_void_*(void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_bool)>
               ::operator()((operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_*(void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_>,_void_*(void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_bool)>
                             *)in_R9,in_stack_fffffffffffff838,args_1_01,
                            SUB81((ulong)in_stack_fffffffffffff830 >> 0x38,0));
      *(uint *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) - local_1c;
      return pvVar3;
    }
    in_stack_fffffffffffff830 = in_R9;
    pvVar3 = in_RCX;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_760,local_18,(ulong)*(uint *)(in_RDI + 0x20));
    args_1_02._M_str = pcVar7;
    args_1_02._M_len = in_stack_fffffffffffff848;
    pvVar3 = fu2::abi_400::detail::type_erasure::invocation_table::
             operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_*(void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_>,_void_*(void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_bool)>
             ::operator()((operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_*(void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_>,_void_*(void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_bool)>
                           *)in_stack_fffffffffffff840,pvVar3,args_1_02,
                          SUB81((ulong)in_stack_fffffffffffff830 >> 0x38,0));
    local_18 = local_18 + *(uint *)(in_RDI + 0x20);
    local_1c = local_1c - *(int *)(in_RDI + 0x20);
    in_RDI[0x20] = '\0';
    in_RDI[0x21] = '\0';
    in_RDI[0x22] = '\0';
    in_RDI[0x23] = '\0';
    local_750 = pvVar3;
  }
  else {
    if (in_EDX <= *(uint *)(in_RDI + 0x20)) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffff918,in_RSI
                 ,(long)(int)in_EDX);
      args_1._M_str = in_stack_fffffffffffff850;
      args_1._M_len = in_stack_fffffffffffff848;
      pvVar3 = fu2::abi_400::detail::type_erasure::invocation_table::
               operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_*(void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_>,_void_*(void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_bool)>
               ::operator()((operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_*(void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_>,_void_*(void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_bool)>
                             *)in_stack_fffffffffffff840,in_stack_fffffffffffff838,args_1,
                            SUB81((ulong)in_stack_fffffffffffff830 >> 0x38,0));
      *(uint *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) - in_EDX;
      return pvVar3;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffff900,in_RSI,
               (ulong)*(uint *)(in_RDI + 0x20));
    args_1_00._M_str = in_stack_fffffffffffff850;
    args_1_00._M_len = in_stack_fffffffffffff848;
    pvVar3 = fu2::abi_400::detail::type_erasure::invocation_table::
             operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_*(void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_>,_void_*(void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_bool)>
             ::operator()((operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_*(void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_>,_void_*(void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_bool)>
                           *)in_stack_fffffffffffff840,in_stack_fffffffffffff838,args_1_00,
                          SUB81((ulong)in_stack_fffffffffffff830 >> 0x38,0));
    local_18 = in_RSI + *(uint *)(in_RDI + 0x20);
    local_1c = in_EDX - *(int *)(in_RDI + 0x20);
    in_RDI[0x20] = '\0';
    in_RDI[0x21] = '\0';
    in_RDI[0x22] = '\0';
    in_RDI[0x23] = '\0';
  }
  if (pvVar3 != in_RCX) {
    return pvVar3;
  }
LAB_0023fafd:
  pVar6 = fenceAndConsumePostPadded<0>
                    (in_stack_fffffffffffff950,in_stack_fffffffffffff948,in_stack_fffffffffffff944,
                     in_stack_fffffffffffff938,in_stack_fffffffffffff930,in_stack_fffffffffffff928,
                     in_stack_fffffffffffff970);
  local_8 = pVar6.second;
  if (local_8 == in_RCX) {
    local_1c = local_1c - pVar6.first;
    local_8 = in_RCX;
    if (local_1c != 0) {
      if ((ulong)local_1c < *(ulong *)(in_RDI + 0x28)) {
        std::__cxx11::string::append(in_RDI,(ulong)(local_18 + pVar6.first));
      }
      else {
        local_8 = fu2::abi_400::detail::type_erasure::invocation_table::
                  operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_*(void_*)>_>,_void_*(void_*)>
                  ::operator()(in_stack_fffffffffffff830,in_R9);
      }
    }
  }
  return local_8;
}

Assistant:

void *consumePostPadded(char *data, int length, void *user, fu2::unique_function<void *(void *, HttpRequest *)> &&requestHandler, fu2::unique_function<void *(void *, std::string_view, bool)> &&dataHandler, fu2::unique_function<void *(void *)> &&errorHandler) {

        HttpRequest req;

        if (remainingStreamingBytes) {

            // this is exactly the same as below!
            // todo: refactor this
            if (remainingStreamingBytes >= (unsigned int) length) {
                void *returnedUser = dataHandler(user, std::string_view(data, length), remainingStreamingBytes == (unsigned int) length);
                remainingStreamingBytes -= length;
                return returnedUser;
            } else {
                void *returnedUser = dataHandler(user, std::string_view(data, remainingStreamingBytes), true);

                data += remainingStreamingBytes;
                length -= remainingStreamingBytes;

                remainingStreamingBytes = 0;

                if (returnedUser != user) {
                    return returnedUser;
                }
            }

        } else if (fallback.length()) {
            int had = (int) fallback.length();

            int maxCopyDistance = (int) std::min(MAX_FALLBACK_SIZE - fallback.length(), (size_t) length);

            /* We don't want fallback to be short string optimized, since we want to move it */
            fallback.reserve(fallback.length() + maxCopyDistance + std::max<int>(MINIMUM_HTTP_POST_PADDING, sizeof(std::string)));
            fallback.append(data, maxCopyDistance);

            // break here on break
            std::pair<int, void *> consumed = fenceAndConsumePostPadded<true>(fallback.data(), (int) fallback.length(), user, &req, requestHandler, dataHandler);
            if (consumed.second != user) {
                return consumed.second;
            }

            if (consumed.first) {

                fallback.clear();

                data += consumed.first - had;
                length -= consumed.first - had;

                if (remainingStreamingBytes) {
                    // this is exactly the same as above!
                    if (remainingStreamingBytes >= (unsigned int) length) {
                        void *returnedUser = dataHandler(user, std::string_view(data, length), remainingStreamingBytes == (unsigned int) length);
                        remainingStreamingBytes -= length;
                        return returnedUser;
                    } else {
                        void *returnedUser = dataHandler(user, std::string_view(data, remainingStreamingBytes), true);

                        data += remainingStreamingBytes;
                        length -= remainingStreamingBytes;

                        remainingStreamingBytes = 0;

                        if (returnedUser != user) {
                            return returnedUser;
                        }
                    }
                }

            } else {
                if (fallback.length() == MAX_FALLBACK_SIZE) {
                    // note: you don't really need error handler, just return something strange!
                    // we could have it return a constant pointer to denote error!
                    return errorHandler(user);
                }
                return user;
            }
        }

        std::pair<int, void *> consumed = fenceAndConsumePostPadded<false>(data, length, user, &req, requestHandler, dataHandler);
        if (consumed.second != user) {
            return consumed.second;
        }

        data += consumed.first;
        length -= consumed.first;

        if (length) {
            if ((unsigned int) length < MAX_FALLBACK_SIZE) {
                fallback.append(data, length);
            } else {
                return errorHandler(user);
            }
        }

        // added for now
        return user;
    }